

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void SobelYRow_SSE2(uint8_t *src_y0,uint8_t *src_y1,uint8_t *dst_sobely,int width)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  unkuint9 Var57;
  undefined1 auVar58 [11];
  undefined1 auVar59 [13];
  undefined1 auVar60 [15];
  unkuint9 Var61;
  undefined1 auVar62 [11];
  undefined1 auVar63 [15];
  unkuint9 Var64;
  undefined1 auVar65 [11];
  undefined1 auVar66 [13];
  undefined1 auVar67 [15];
  unkuint9 Var68;
  undefined1 auVar69 [11];
  undefined1 auVar70 [15];
  unkuint9 Var71;
  undefined1 auVar72 [11];
  undefined1 auVar73 [15];
  unkuint9 Var74;
  undefined1 auVar75 [11];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  int iVar88;
  long lVar89;
  long lVar90;
  short sVar91;
  ushort uVar92;
  short sVar93;
  ushort uVar94;
  short sVar95;
  ushort uVar96;
  short sVar97;
  ushort uVar98;
  short sVar99;
  ushort uVar100;
  short sVar101;
  ushort uVar102;
  short sVar103;
  ushort uVar104;
  short sVar105;
  ushort uVar106;
  
  lVar90 = (long)src_y1 - (long)src_y0;
  lVar89 = (long)dst_sobely - (long)src_y0;
  do {
    uVar1 = *(ulong *)src_y0;
    uVar2 = *(ulong *)((long)src_y0 + lVar90);
    auVar21._8_6_ = 0;
    auVar21._0_8_ = uVar1;
    auVar21[0xe] = (char)(uVar1 >> 0x38);
    auVar27._8_4_ = 0;
    auVar27._0_8_ = uVar1;
    auVar27[0xc] = (char)(uVar1 >> 0x30);
    auVar27._13_2_ = auVar21._13_2_;
    auVar33._8_4_ = 0;
    auVar33._0_8_ = uVar1;
    auVar33._12_3_ = auVar27._12_3_;
    auVar39._8_2_ = 0;
    auVar39._0_8_ = uVar1;
    auVar39[10] = (char)(uVar1 >> 0x28);
    auVar39._11_4_ = auVar33._11_4_;
    auVar45._8_2_ = 0;
    auVar45._0_8_ = uVar1;
    auVar45._10_5_ = auVar39._10_5_;
    auVar51[8] = (char)(uVar1 >> 0x20);
    auVar51._0_8_ = uVar1;
    auVar51._9_6_ = auVar45._9_6_;
    auVar56._7_8_ = 0;
    auVar56._0_7_ = auVar51._8_7_;
    Var57 = CONCAT81(SUB158(auVar56 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar76._9_6_ = 0;
    auVar76._0_9_ = Var57;
    auVar58._1_10_ = SUB1510(auVar76 << 0x30,5);
    auVar58[0] = (char)(uVar1 >> 0x10);
    auVar77._11_4_ = 0;
    auVar77._0_11_ = auVar58;
    auVar59._1_12_ = SUB1512(auVar77 << 0x20,3);
    auVar59[0] = (char)(uVar1 >> 8);
    auVar16._8_6_ = 0;
    auVar16._0_8_ = uVar2;
    auVar16[0xe] = (char)(uVar2 >> 0x38);
    auVar22._8_4_ = 0;
    auVar22._0_8_ = uVar2;
    auVar22[0xc] = (char)(uVar2 >> 0x30);
    auVar22._13_2_ = auVar16._13_2_;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = uVar2;
    auVar28._12_3_ = auVar22._12_3_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = uVar2;
    auVar34[10] = (char)(uVar2 >> 0x28);
    auVar34._11_4_ = auVar28._11_4_;
    auVar40._8_2_ = 0;
    auVar40._0_8_ = uVar2;
    auVar40._10_5_ = auVar34._10_5_;
    auVar46[8] = (char)(uVar2 >> 0x20);
    auVar46._0_8_ = uVar2;
    auVar46._9_6_ = auVar40._9_6_;
    auVar60._7_8_ = 0;
    auVar60._0_7_ = auVar46._8_7_;
    Var61 = CONCAT81(SUB158(auVar60 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar78._9_6_ = 0;
    auVar78._0_9_ = Var61;
    auVar62._1_10_ = SUB1510(auVar78 << 0x30,5);
    auVar62[0] = (char)(uVar2 >> 0x10);
    auVar79._11_4_ = 0;
    auVar79._0_11_ = auVar62;
    auVar52[2] = (char)(uVar2 >> 8);
    auVar52._0_2_ = (ushort)uVar2;
    auVar52._3_12_ = SUB1512(auVar79 << 0x20,3);
    uVar3 = *(ulong *)((long)src_y0 + 1);
    uVar4 = *(ulong *)((long)src_y0 + lVar90 + 1);
    auVar17._8_6_ = 0;
    auVar17._0_8_ = uVar3;
    auVar17[0xe] = (char)(uVar3 >> 0x38);
    auVar23._8_4_ = 0;
    auVar23._0_8_ = uVar3;
    auVar23[0xc] = (char)(uVar3 >> 0x30);
    auVar23._13_2_ = auVar17._13_2_;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = uVar3;
    auVar29._12_3_ = auVar23._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar3;
    auVar35[10] = (char)(uVar3 >> 0x28);
    auVar35._11_4_ = auVar29._11_4_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = uVar3;
    auVar41._10_5_ = auVar35._10_5_;
    auVar47[8] = (char)(uVar3 >> 0x20);
    auVar47._0_8_ = uVar3;
    auVar47._9_6_ = auVar41._9_6_;
    auVar63._7_8_ = 0;
    auVar63._0_7_ = auVar47._8_7_;
    Var64 = CONCAT81(SUB158(auVar63 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar80._9_6_ = 0;
    auVar80._0_9_ = Var64;
    auVar65._1_10_ = SUB1510(auVar80 << 0x30,5);
    auVar65[0] = (char)(uVar3 >> 0x10);
    auVar81._11_4_ = 0;
    auVar81._0_11_ = auVar65;
    auVar66._1_12_ = SUB1512(auVar81 << 0x20,3);
    auVar66[0] = (char)(uVar3 >> 8);
    auVar18._8_6_ = 0;
    auVar18._0_8_ = uVar4;
    auVar18[0xe] = (char)(uVar4 >> 0x38);
    auVar24._8_4_ = 0;
    auVar24._0_8_ = uVar4;
    auVar24[0xc] = (char)(uVar4 >> 0x30);
    auVar24._13_2_ = auVar18._13_2_;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = uVar4;
    auVar30._12_3_ = auVar24._12_3_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = uVar4;
    auVar36[10] = (char)(uVar4 >> 0x28);
    auVar36._11_4_ = auVar30._11_4_;
    auVar42._8_2_ = 0;
    auVar42._0_8_ = uVar4;
    auVar42._10_5_ = auVar36._10_5_;
    auVar48[8] = (char)(uVar4 >> 0x20);
    auVar48._0_8_ = uVar4;
    auVar48._9_6_ = auVar42._9_6_;
    auVar67._7_8_ = 0;
    auVar67._0_7_ = auVar48._8_7_;
    Var68 = CONCAT81(SUB158(auVar67 << 0x40,7),(char)(uVar4 >> 0x18));
    auVar82._9_6_ = 0;
    auVar82._0_9_ = Var68;
    auVar69._1_10_ = SUB1510(auVar82 << 0x30,5);
    auVar69[0] = (char)(uVar4 >> 0x10);
    auVar83._11_4_ = 0;
    auVar83._0_11_ = auVar69;
    auVar53[2] = (char)(uVar4 >> 8);
    auVar53._0_2_ = (ushort)uVar4;
    auVar53._3_12_ = SUB1512(auVar83 << 0x20,3);
    uVar5 = *(ulong *)((long)src_y0 + 2);
    uVar6 = *(ulong *)((long)src_y0 + lVar90 + 2);
    auVar19._8_6_ = 0;
    auVar19._0_8_ = uVar5;
    auVar19[0xe] = (char)(uVar5 >> 0x38);
    auVar25._8_4_ = 0;
    auVar25._0_8_ = uVar5;
    auVar25[0xc] = (char)(uVar5 >> 0x30);
    auVar25._13_2_ = auVar19._13_2_;
    auVar31._8_4_ = 0;
    auVar31._0_8_ = uVar5;
    auVar31._12_3_ = auVar25._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = uVar5;
    auVar37[10] = (char)(uVar5 >> 0x28);
    auVar37._11_4_ = auVar31._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = uVar5;
    auVar43._10_5_ = auVar37._10_5_;
    auVar49[8] = (char)(uVar5 >> 0x20);
    auVar49._0_8_ = uVar5;
    auVar49._9_6_ = auVar43._9_6_;
    auVar70._7_8_ = 0;
    auVar70._0_7_ = auVar49._8_7_;
    Var71 = CONCAT81(SUB158(auVar70 << 0x40,7),(char)(uVar5 >> 0x18));
    auVar84._9_6_ = 0;
    auVar84._0_9_ = Var71;
    auVar72._1_10_ = SUB1510(auVar84 << 0x30,5);
    auVar72[0] = (char)(uVar5 >> 0x10);
    auVar85._11_4_ = 0;
    auVar85._0_11_ = auVar72;
    auVar54[2] = (char)(uVar5 >> 8);
    auVar54._0_2_ = (ushort)uVar5;
    auVar54._3_12_ = SUB1512(auVar85 << 0x20,3);
    auVar20._8_6_ = 0;
    auVar20._0_8_ = uVar6;
    auVar20[0xe] = (char)(uVar6 >> 0x38);
    auVar26._8_4_ = 0;
    auVar26._0_8_ = uVar6;
    auVar26[0xc] = (char)(uVar6 >> 0x30);
    auVar26._13_2_ = auVar20._13_2_;
    auVar32._8_4_ = 0;
    auVar32._0_8_ = uVar6;
    auVar32._12_3_ = auVar26._12_3_;
    auVar38._8_2_ = 0;
    auVar38._0_8_ = uVar6;
    auVar38[10] = (char)(uVar6 >> 0x28);
    auVar38._11_4_ = auVar32._11_4_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = uVar6;
    auVar44._10_5_ = auVar38._10_5_;
    auVar50[8] = (char)(uVar6 >> 0x20);
    auVar50._0_8_ = uVar6;
    auVar50._9_6_ = auVar44._9_6_;
    auVar73._7_8_ = 0;
    auVar73._0_7_ = auVar50._8_7_;
    Var74 = CONCAT81(SUB158(auVar73 << 0x40,7),(char)(uVar6 >> 0x18));
    auVar86._9_6_ = 0;
    auVar86._0_9_ = Var74;
    auVar75._1_10_ = SUB1510(auVar86 << 0x30,5);
    auVar75[0] = (char)(uVar6 >> 0x10);
    auVar87._11_4_ = 0;
    auVar87._0_11_ = auVar75;
    auVar55[2] = (char)(uVar6 >> 8);
    auVar55._0_2_ = (ushort)uVar6;
    auVar55._3_12_ = SUB1512(auVar87 << 0x20,3);
    sVar91 = ((ushort)(byte)uVar1 - ((ushort)uVar2 & 0xff)) +
             (((ushort)uVar5 & 0xff) - ((ushort)uVar6 & 0xff)) +
             ((ushort)(byte)uVar3 - ((ushort)uVar4 & 0xff)) * 2;
    sVar93 = (auVar59._0_2_ - auVar52._2_2_) + (auVar54._2_2_ - auVar55._2_2_) +
             (auVar66._0_2_ - auVar53._2_2_) * 2;
    sVar95 = (auVar58._0_2_ - auVar62._0_2_) + (auVar72._0_2_ - auVar75._0_2_) +
             (auVar65._0_2_ - auVar69._0_2_) * 2;
    sVar97 = ((short)Var57 - (short)Var61) + ((short)Var71 - (short)Var74) +
             ((short)Var64 - (short)Var68) * 2;
    sVar99 = (auVar51._8_2_ - auVar46._8_2_) + (auVar49._8_2_ - auVar50._8_2_) +
             (auVar47._8_2_ - auVar48._8_2_) * 2;
    sVar101 = (auVar39._10_2_ - auVar34._10_2_) + (auVar37._10_2_ - auVar38._10_2_) +
              (auVar35._10_2_ - auVar36._10_2_) * 2;
    sVar103 = (auVar27._12_2_ - auVar22._12_2_) + (auVar25._12_2_ - auVar26._12_2_) +
              (auVar23._12_2_ - auVar24._12_2_) * 2;
    sVar105 = ((auVar21._13_2_ >> 8) - (auVar16._13_2_ >> 8)) +
              ((auVar19._13_2_ >> 8) - (auVar20._13_2_ >> 8)) +
              ((auVar17._13_2_ >> 8) - (auVar18._13_2_ >> 8)) * 2;
    sVar8 = -sVar91;
    sVar9 = -sVar93;
    sVar10 = -sVar95;
    sVar11 = -sVar97;
    sVar12 = -sVar99;
    sVar13 = -sVar101;
    sVar14 = -sVar103;
    sVar15 = -sVar105;
    uVar92 = (ushort)(sVar91 < sVar8) * sVar8 | (ushort)(sVar91 >= sVar8) * sVar91;
    uVar94 = (ushort)(sVar93 < sVar9) * sVar9 | (ushort)(sVar93 >= sVar9) * sVar93;
    uVar96 = (ushort)(sVar95 < sVar10) * sVar10 | (ushort)(sVar95 >= sVar10) * sVar95;
    uVar98 = (ushort)(sVar97 < sVar11) * sVar11 | (ushort)(sVar97 >= sVar11) * sVar97;
    uVar100 = (ushort)(sVar99 < sVar12) * sVar12 | (ushort)(sVar99 >= sVar12) * sVar99;
    uVar102 = (ushort)(sVar101 < sVar13) * sVar13 | (ushort)(sVar101 >= sVar13) * sVar101;
    uVar104 = (ushort)(sVar103 < sVar14) * sVar14 | (ushort)(sVar103 >= sVar14) * sVar103;
    uVar106 = (ushort)(sVar105 < sVar15) * sVar15 | (ushort)(sVar105 >= sVar15) * sVar105;
    *(ulong *)((long)src_y0 + lVar89) =
         CONCAT17((0 < (short)uVar106) * ((short)uVar106 < 0x100) * (char)uVar106 -
                  (0xff < (short)uVar106),
                  CONCAT16((0 < (short)uVar104) * ((short)uVar104 < 0x100) * (char)uVar104 -
                           (0xff < (short)uVar104),
                           CONCAT15((0 < (short)uVar102) * ((short)uVar102 < 0x100) * (char)uVar102
                                    - (0xff < (short)uVar102),
                                    CONCAT14((0 < (short)uVar100) * ((short)uVar100 < 0x100) *
                                             (char)uVar100 - (0xff < (short)uVar100),
                                             CONCAT13((0 < (short)uVar98) * ((short)uVar98 < 0x100)
                                                      * (char)uVar98 - (0xff < (short)uVar98),
                                                      CONCAT12((0 < (short)uVar96) *
                                                               ((short)uVar96 < 0x100) *
                                                               (char)uVar96 - (0xff < (short)uVar96)
                                                               ,CONCAT11((0 < (short)uVar94) *
                                                                         ((short)uVar94 < 0x100) *
                                                                         (char)uVar94 -
                                                                         (0xff < (short)uVar94),
                                                                         (0 < (short)uVar92) *
                                                                         ((short)uVar92 < 0x100) *
                                                                         (char)uVar92 -
                                                                         (0xff < (short)uVar92))))))
                          ));
    src_y0 = (uint8_t *)((long)src_y0 + 8);
    iVar88 = width + -8;
    bVar7 = 7 < width;
    width = iVar88;
  } while (iVar88 != 0 && bVar7);
  return;
}

Assistant:

void SobelYRow_SSE2(const uint8_t* src_y0,
                    const uint8_t* src_y1,
                    uint8_t* dst_sobely,
                    int width) {
  asm volatile(
      "sub         %0,%1                         \n"
      "sub         %0,%2                         \n"
      "pxor        %%xmm5,%%xmm5                 \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movq        (%0),%%xmm0                   \n"
      "movq        0x00(%0,%1,1),%%xmm1          \n"
      "punpcklbw   %%xmm5,%%xmm0                 \n"
      "punpcklbw   %%xmm5,%%xmm1                 \n"
      "psubw       %%xmm1,%%xmm0                 \n"
      "movq        0x1(%0),%%xmm1                \n"
      "movq        0x01(%0,%1,1),%%xmm2          \n"
      "punpcklbw   %%xmm5,%%xmm1                 \n"
      "punpcklbw   %%xmm5,%%xmm2                 \n"
      "psubw       %%xmm2,%%xmm1                 \n"
      "movq        0x2(%0),%%xmm2                \n"
      "movq        0x02(%0,%1,1),%%xmm3          \n"
      "punpcklbw   %%xmm5,%%xmm2                 \n"
      "punpcklbw   %%xmm5,%%xmm3                 \n"
      "psubw       %%xmm3,%%xmm2                 \n"
      "paddw       %%xmm2,%%xmm0                 \n"
      "paddw       %%xmm1,%%xmm0                 \n"
      "paddw       %%xmm1,%%xmm0                 \n"
      "pxor        %%xmm1,%%xmm1                 \n"
      "psubw       %%xmm0,%%xmm1                 \n"
      "pmaxsw      %%xmm1,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movq        %%xmm0,0x00(%0,%2,1)          \n"
      "lea         0x8(%0),%0                    \n"
      "sub         $0x8,%3                       \n"
      "jg          1b                            \n"
      : "+r"(src_y0),      // %0
        "+r"(src_y1),      // %1
        "+r"(dst_sobely),  // %2
        "+r"(width)        // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}